

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O1

uint __thiscall TArray<FTeam,_FTeam>::Push(TArray<FTeam,_FTeam> *this,FTeam *item)

{
  uint uVar1;
  FTeam *pFVar2;
  undefined8 uVar3;
  int iVar4;
  FString *this_00;
  
  Grow(this,1);
  pFVar2 = this->Array;
  uVar1 = this->Count;
  iVar4 = item->m_iScore;
  uVar3 = *(undefined8 *)&item->m_iPresent;
  this_00 = &pFVar2[uVar1].m_Name;
  *(int *)&this_00[-2].Chars = item->m_iPlayerCount;
  *(int *)((long)&this_00[-2].Chars + 4) = iVar4;
  this_00[-1] = (FString)uVar3;
  FString::AttachToOther(this_00,&item->m_Name);
  *(int *)(this_00 + 1) = item->m_iPlayerColor;
  FString::AttachToOther(&pFVar2[uVar1].m_TextColor,&item->m_TextColor);
  FString::AttachToOther(&pFVar2[uVar1].m_Logo,&item->m_Logo);
  pFVar2[uVar1].m_bAllowCustomPlayerColor = item->m_bAllowCustomPlayerColor;
  uVar1 = this->Count;
  this->Count = uVar1 + 1;
  return uVar1;
}

Assistant:

unsigned int Push (const T &item)
	{
		Grow (1);
		::new((void*)&Array[Count]) T(item);
		return Count++;
	}